

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O3

int GetAddrPortTypeFromDevPath
              (char *szDevPath,char *address,size_t addresslen,char *port,size_t portlen,
              int *pDevType)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)(szDevPath == (char *)0x0);
  auVar8._4_4_ = -(uint)(address == (char *)0x0);
  auVar8._8_4_ = -(uint)(port == (char *)0x0);
  auVar8._12_4_ = -(uint)(pDevType == (int *)0x0);
  iVar7 = movmskps((int)addresslen,auVar8);
  if ((portlen < 6 || addresslen < 0x10) || iVar7 != 0) {
    return 1;
  }
  pcVar5 = (char *)0x0;
  *address = '\0';
  *port = '\0';
  *pDevType = 0;
  pcVar3 = strchr(szDevPath,0x3a);
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(pcVar3);
    if (sVar4 < 6) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strchr(pcVar3 + 1,0x3a);
    }
  }
  sVar4 = strlen(szDevPath);
  if (sVar4 < 0x15) {
    if (sVar4 == 0x14) {
LAB_001100a8:
      iVar7 = strncmp(szDevPath,"tcp-listen:",0xb);
      if (((pcVar5 == (char *)0x0) || (iVar7 != 0)) || (pcVar5[1] == '\0')) {
        iVar7 = strncmp(szDevPath,"udp-listen:",0xb);
        if (((pcVar5 == (char *)0x0) || (iVar7 != 0)) || (pcVar5[1] == '\0')) goto LAB_00110106;
        pcVar3 = szDevPath + 0xb;
LAB_001102f7:
        sVar4 = (long)pcVar5 - (long)pcVar3;
        if (addresslen < sVar4 + 1) {
          return 1;
        }
        pcVar5 = pcVar5 + 1;
        sVar6 = strlen(pcVar5);
        if (portlen < sVar6 + 1) {
          return 1;
        }
        memcpy(address,pcVar3,sVar4);
        address[sVar4 + 1] = '\0';
LAB_00110349:
        strcpy(port,pcVar5);
        iVar7 = 4;
        goto LAB_00110430;
      }
      pcVar3 = szDevPath + 0xb;
LAB_00110231:
      sVar4 = (long)pcVar5 - (long)pcVar3;
      if (addresslen < sVar4 + 1) {
        return 1;
      }
      pcVar5 = pcVar5 + 1;
      sVar6 = strlen(pcVar5);
      if (portlen < sVar6 + 1) {
        return 1;
      }
      memcpy(address,pcVar3,sVar4);
      address[sVar4 + 1] = '\0';
    }
    else {
      if (0x11 < sVar4) {
LAB_00110106:
        iVar7 = strncmp(szDevPath,"tcpsrv://",9);
        if (iVar7 == 0) {
          if (pcVar5 != (char *)0x0) goto LAB_00110142;
          iVar7 = strncmp(szDevPath,"udpsrv://",9);
          if (iVar7 == 0) goto LAB_001101e7;
LAB_001101bb:
          iVar7 = strncmp(szDevPath,"udpsvr://",9);
          if ((pcVar5 == (char *)0x0) || (iVar7 != 0)) goto LAB_001101e7;
        }
        else {
          iVar7 = strncmp(szDevPath,"tcpsvr://",9);
          if ((pcVar5 != (char *)0x0) && (iVar7 == 0)) {
LAB_00110142:
            if (pcVar5[1] != '\0') {
              pcVar3 = szDevPath + 9;
              goto LAB_00110231;
            }
          }
          iVar7 = strncmp(szDevPath,"udpsrv://",9);
          if (iVar7 != 0) goto LAB_001101bb;
          if (pcVar5 == (char *)0x0) goto LAB_001101e7;
        }
        if (pcVar5[1] != '\0') {
          pcVar3 = szDevPath + 9;
          goto LAB_001102f7;
        }
LAB_001101e7:
        iVar7 = strncmp(szDevPath,"tcpsrv:",7);
        if (iVar7 == 0) {
          if (pcVar5 != (char *)0x0) goto LAB_00110227;
          iVar7 = strncmp(szDevPath,"udpsrv:",7);
          if (iVar7 == 0) goto LAB_00110358;
LAB_001102d0:
          iVar7 = strncmp(szDevPath,"udpsvr:",7);
          if ((pcVar5 == (char *)0x0) || (iVar7 != 0)) goto LAB_00110358;
        }
        else {
          iVar7 = strncmp(szDevPath,"tcpsvr:",7);
          if ((pcVar5 != (char *)0x0) && (iVar7 == 0)) {
LAB_00110227:
            if (pcVar5[1] != '\0') {
              pcVar3 = szDevPath + 7;
              goto LAB_00110231;
            }
          }
          iVar7 = strncmp(szDevPath,"udpsrv:",7);
          if (iVar7 != 0) goto LAB_001102d0;
          if (pcVar5 == (char *)0x0) goto LAB_00110358;
        }
        if (pcVar5[1] != '\0') {
          pcVar3 = szDevPath + 7;
          goto LAB_001102f7;
        }
LAB_00110358:
        iVar7 = strncmp(szDevPath,"tcp://",6);
        if (((pcVar5 == (char *)0x0) || (iVar7 != 0)) || (pcVar5[1] == '\0')) {
          iVar7 = strncmp(szDevPath,"udp://",6);
          if (((pcVar5 == (char *)0x0) || (iVar7 != 0)) || (pcVar5[1] == '\0')) goto LAB_001103ad;
          pcVar3 = szDevPath + 6;
LAB_00110466:
          sVar4 = (long)pcVar5 - (long)pcVar3;
          if (addresslen < sVar4 + 1) {
            return 1;
          }
          sVar6 = strlen(pcVar5 + 1);
          if (portlen < sVar6 + 1) {
            return 1;
          }
          memcpy(address,pcVar3,sVar4);
          address[sVar4 + 1] = '\0';
          strcpy(port,pcVar5 + 1);
          iVar7 = 3;
          goto LAB_00110430;
        }
        pcVar3 = szDevPath + 6;
        goto LAB_001103d4;
      }
      if (0xf < sVar4) goto LAB_001101e7;
      if (sVar4 == 0xf) goto LAB_00110358;
      if (sVar4 < 0xd) {
        if (7 < sVar4) goto LAB_001104c7;
        if (4 < sVar4) {
LAB_001105a5:
          iVar7 = strncmp(szDevPath,"tcp:",4);
          if (iVar7 == 0) {
            pcVar5 = szDevPath + 4;
            iVar7 = atoi(pcVar5);
            if (0 < iVar7) {
              sVar4 = strlen(pcVar5);
              goto joined_r0x0011062f;
            }
          }
          iVar7 = strncmp(szDevPath,"udp:",4);
          if (iVar7 == 0) {
            pcVar5 = szDevPath + 4;
            iVar7 = atoi(pcVar5);
            if (0 < iVar7) {
              sVar4 = strlen(pcVar5);
              goto joined_r0x00110746;
            }
          }
        }
        if (pcVar3 == (char *)0x0) {
          return 0;
        }
        bVar1 = *szDevPath;
        if (bVar1 == 0x3a) {
          pcVar5 = szDevPath + 1;
          iVar7 = atoi(pcVar5);
          if (0 < iVar7) {
            sVar4 = strlen(pcVar5);
            goto joined_r0x0011062f;
          }
        }
        pcVar5 = pcVar3 + 1;
        iVar7 = atoi(pcVar5);
        if (9 < bVar1 - 0x30 || iVar7 < 1) {
          return 0;
        }
        sVar4 = (long)pcVar3 - (long)szDevPath;
        if (addresslen < sVar4 + 1) {
          return 1;
        }
        sVar6 = strlen(pcVar5);
        if (portlen < sVar6 + 1) {
          return 1;
        }
        memcpy(address,szDevPath,sVar4);
        address[sVar4 + 1] = '\0';
        uVar2 = atoi(pcVar5);
        sprintf(port,"%d",(ulong)uVar2);
        goto LAB_0011042b;
      }
LAB_001103ad:
      iVar7 = strncmp(szDevPath,"tcp:",4);
      if (((pcVar5 != (char *)0x0) && (iVar7 == 0)) && (pcVar5[1] != '\0')) {
        pcVar3 = szDevPath + 4;
        goto LAB_001103d4;
      }
      iVar7 = strncmp(szDevPath,"udp:",4);
      if (((pcVar5 != (char *)0x0) && (iVar7 == 0)) && (pcVar5[1] != '\0')) {
        pcVar3 = szDevPath + 4;
        goto LAB_00110466;
      }
LAB_001104c7:
      iVar7 = strncmp(szDevPath,"tcpsrv:",7);
      if (((iVar7 != 0) && (iVar7 = strncmp(szDevPath,"tcpsvr:",7), iVar7 != 0)) ||
         (iVar7 = atoi(szDevPath + 4), iVar7 < 1)) {
        iVar7 = strncmp(szDevPath,"udpsrv:",7);
        if (((iVar7 != 0) && (iVar7 = strncmp(szDevPath,"udpsvr:",7), iVar7 != 0)) ||
           (iVar7 = atoi(szDevPath + 4), iVar7 < 1)) goto LAB_001105a5;
        pcVar5 = szDevPath + 7;
        sVar4 = strlen(pcVar5);
joined_r0x00110746:
        if (portlen < sVar4 + 1) {
          return 1;
        }
        goto LAB_00110349;
      }
      pcVar5 = szDevPath + 7;
      sVar4 = strlen(pcVar5);
joined_r0x0011062f:
      if (portlen < sVar4 + 1) {
        return 1;
      }
    }
    strcpy(port,pcVar5);
    iVar7 = 2;
  }
  else {
    iVar7 = strncmp(szDevPath,"tcp-connect:",0xc);
    if (((pcVar5 == (char *)0x0) || (iVar7 != 0)) || (pcVar5[1] == '\0')) goto LAB_001100a8;
    pcVar3 = szDevPath + 0xc;
LAB_001103d4:
    sVar4 = (long)pcVar5 - (long)pcVar3;
    if (addresslen < sVar4 + 1) {
      return 1;
    }
    sVar6 = strlen(pcVar5 + 1);
    if (portlen < sVar6 + 1) {
      return 1;
    }
    memcpy(address,pcVar3,sVar4);
    address[sVar4 + 1] = '\0';
    strcpy(port,pcVar5 + 1);
LAB_0011042b:
    iVar7 = 1;
  }
LAB_00110430:
  *pDevType = iVar7;
  return 0;
}

Assistant:

inline int GetAddrPortTypeFromDevPath(char* szDevPath, char* address, size_t addresslen, char* port, size_t portlen, int* pDevType)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	size_t tmplen = 0;

	if ((szDevPath == NULL)||(address == NULL)||(port == NULL)||(pDevType == NULL)||(addresslen < 16)||(portlen < 6)) return EXIT_FAILURE;

	address[0] = 0;
	port[0] = 0;
	*pDevType = OTHER_DEV_TYPE_OSNET;

	ptr = strchr(szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');

	if ((strlen(szDevPath) >= 12+7+1+1)&&(strncmp(szDevPath, "tcp-connect:", strlen("tcp-connect:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+12);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+12, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "tcp-listen:", strlen("tcp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "udp-listen:", strlen("udp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)||(strncmp(szDevPath, "tcpsvr://", strlen("tcpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "udpsrv://", strlen("udpsrv://")) == 0)||(strncmp(szDevPath, "udpsvr://", strlen("udpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(szDevPath[0] == ':')&&(atoi(szDevPath+1) > 0))
	{
		if (portlen < strlen(szDevPath+1)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(atoi(ptr+1) > 0)&&(isdigit((unsigned char)szDevPath[0])))
	{
		tmplen = ptr-szDevPath;
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath, tmplen);
		address[tmplen+1] = 0;
		//strcpy(port, ptr+1);
		sprintf(port, "%d", atoi(ptr+1)); // Other non-digit characters may follow the port...
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}

	return EXIT_SUCCESS;
}